

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char cVar1;
  char cVar2;
  uint size;
  uint uVar3;
  type tVar4;
  buffer_appender<char> bVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  void *pvVar9;
  char *pcVar10;
  uint uVar11;
  ulong count;
  ulong uVar12;
  int value;
  long lVar13;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  locale_ref in_stack_fffffffffffffd68;
  locale_ref in_stack_fffffffffffffd70;
  char acStack_279 [41];
  anon_class_16_2_3f014a30 local_250;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_240;
  
  grouping_impl<char>(in_stack_fffffffffffffd70);
  if (in_stack_fffffffffffffd70.locale_ == (void *)0x0) {
    on_dec(this);
  }
  else {
    cVar2 = thousands_sep_impl<char>(in_stack_fffffffffffffd68);
    if (cVar2 == '\0') {
      on_dec(this);
    }
    else {
      size = count_digits(this->abs_value);
      iVar6 = (int)in_stack_fffffffffffffd70.locale_ + size;
      uVar12 = (ulong)size;
      uVar3 = size;
      for (pvVar9 = (void *)0x0; in_stack_fffffffffffffd70.locale_ != pvVar9;
          pvVar9 = (void *)((long)pvVar9 + 1)) {
        cVar1 = *(char *)((long)in_stack_fffffffffffffd68.locale_ + (long)pvVar9);
        uVar11 = uVar3 - (int)cVar1;
        if ((uVar11 == 0 || (int)uVar3 < (int)cVar1) || ((byte)(cVar1 + 0x81U) < 0x82)) {
          iVar6 = size + (int)pvVar9;
          if (in_stack_fffffffffffffd70.locale_ != pvVar9) goto LAB_00224b6a;
          break;
        }
        uVar3 = uVar11;
      }
      iVar6 = (int)(uVar3 - 1) /
              (int)((char *)((long)in_stack_fffffffffffffd68.locale_ + -1))
                   [(long)in_stack_fffffffffffffd70.locale_] + iVar6;
LAB_00224b6a:
      format_decimal<char,unsigned_int>(acStack_279 + 1,this->abs_value,size);
      local_240.super_buffer<char>.ptr_ = local_240.store_;
      local_240.super_buffer<char>.size_ = 0;
      local_240.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00277278;
      local_240.super_buffer<char>.capacity_ = 500;
      lVar13 = (long)iVar6 + (long)(int)this->prefix_size;
      value = (int)lVar13;
      tVar4 = to_unsigned<int>(value);
      count = (ulong)tVar4;
      buffer<char>::try_resize(&local_240.super_buffer<char>,count);
      iVar6 = 0;
      pcVar8 = local_240.super_buffer<char>.ptr_ + lVar13 + -1;
      pcVar10 = (char *)in_stack_fffffffffffffd68.locale_;
      while (pcVar7 = pcVar8, 1 < (int)uVar12) {
        pcVar8 = acStack_279 + uVar12;
        uVar12 = uVar12 - 1;
        *pcVar7 = *pcVar8;
        pcVar8 = pcVar7 + -1;
        cVar1 = *pcVar10;
        if ('\0' < cVar1) {
          iVar6 = iVar6 + 1;
          if ((cVar1 != '\x7f') && (iVar6 % (int)cVar1 == 0)) {
            if (pcVar10 + 1 !=
                (char *)((long)in_stack_fffffffffffffd68.locale_ +
                        (long)in_stack_fffffffffffffd70.locale_)) {
              iVar6 = 0;
              pcVar10 = pcVar10 + 1;
            }
            *pcVar8 = cVar2;
            pcVar8 = pcVar7 + -2;
          }
        }
      }
      *pcVar7 = acStack_279[1];
      if (this->prefix_size != 0) {
        pcVar7[-1] = '-';
      }
      local_250.data = local_240.super_buffer<char>.ptr_;
      local_250.size = value;
      bVar5 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_int>::on_num()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                        ((buffer_appender<char>)
                         (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                         container,this->specs,count,count,&local_250);
      (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&local_240);
    }
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }